

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

void icetImageCopyColorf(IceTImage image,IceTFloat *color_buffer,IceTEnum out_color_format)

{
  IceTUByte *pIVar1;
  IceTFloat *__src;
  long lVar2;
  int iVar3;
  size_t __n;
  IceTEnum type;
  char *msg;
  
  if (image.opaque_internals == (IceTVoid *)0x0) {
    iVar3 = 0xc000;
  }
  else {
    iVar3 = *(int *)((long)image.opaque_internals + 4);
  }
  if (out_color_format == 0xc002) {
    if (iVar3 == 0xc002) {
      __src = icetImageGetColorcf(image);
      if (image.opaque_internals == (IceTVoid *)0x0) {
        __n = 0;
      }
      else {
        __n = (size_t)(*(int *)((long)image.opaque_internals + 0xc) *
                       *(int *)((long)image.opaque_internals + 0x10) * 0x10);
      }
      memcpy(color_buffer,__src,__n);
      return;
    }
    if (iVar3 == 0xc001) {
      pIVar1 = icetImageGetColorcub(image);
      lVar2 = 0;
      iVar3 = 0;
      if (image.opaque_internals != (IceTVoid *)0x0) {
        iVar3 = *(int *)((long)image.opaque_internals + 0xc) *
                *(int *)((long)image.opaque_internals + 0x10) * 4;
      }
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      for (; iVar3 != (int)lVar2; lVar2 = lVar2 + 1) {
        color_buffer[lVar2] = (IceTFloat)((float)pIVar1[lVar2] / 255.0);
      }
      return;
    }
    if (iVar3 == 0xc000) {
      msg = "Input image has no color data.";
      type = 0xfffffffb;
      iVar3 = 0x324;
    }
    else {
      msg = "Unexpected format combination.";
      type = 0xffffffff;
      iVar3 = 0x33a;
    }
  }
  else {
    msg = "Color format is not of type float.";
    type = 0xfffffffe;
    iVar3 = 799;
  }
  icetRaiseDiagnostic(msg,type,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                      ,iVar3);
  return;
}

Assistant:

void icetImageCopyColorf(const IceTImage image,
                         IceTFloat *color_buffer,
                         IceTEnum out_color_format)
{
    IceTEnum in_color_format = icetImageGetColorFormat(image);

    if (out_color_format != ICET_IMAGE_COLOR_RGBA_FLOAT) {
        icetRaiseError("Color format is not of type float.",
                       ICET_INVALID_ENUM);
        return;
    }
    if (in_color_format == ICET_IMAGE_COLOR_NONE) {
        icetRaiseError("Input image has no color data.",
                       ICET_INVALID_OPERATION);
        return;
    }

    if (in_color_format == out_color_format) {
        const IceTFloat *in_buffer = icetImageGetColorcf(image);
        IceTSizeType color_format_bytes = (  icetImageGetNumPixels(image)
                                           * colorPixelSize(in_color_format) );
        memcpy(color_buffer, in_buffer, color_format_bytes);
    } else if (   (in_color_format == ICET_IMAGE_COLOR_RGBA_UBYTE)
               && (out_color_format == ICET_IMAGE_COLOR_RGBA_FLOAT) ) {
        const IceTUByte *in_buffer = icetImageGetColorcub(image);
        IceTSizeType num_pixels = icetImageGetNumPixels(image);
        IceTSizeType i;
        const IceTUByte *in;
        IceTFloat *out;
        for (i = 0, in = in_buffer, out = color_buffer; i < 4*num_pixels;
             i++, in++, out++) {
            out[0] = (IceTFloat)in[0]/255.0f;
        }
    } else {
        icetRaiseError("Unexpected format combination.",
                       ICET_SANITY_CHECK_FAIL);
    }
}